

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

int findLocation(string *str,int begin,int end,char op)

{
  char cVar1;
  runtime_error *this;
  long lVar2;
  int iVar3;
  int iVar4;
  
  if (begin < end) {
    lVar2 = (long)end;
    iVar3 = end + -1;
    iVar4 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[lVar2 + -1];
      if (cVar1 == '(') {
        if (iVar4 < 1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"parentheses mismatch");
          goto LAB_00167898;
        }
        iVar4 = iVar4 + -1;
      }
      else if (cVar1 == ')') {
        iVar4 = iVar4 + 1;
      }
      else if ((iVar4 < 1) && (cVar1 == op)) {
        return iVar3;
      }
      lVar2 = lVar2 + -1;
      iVar3 = iVar3 + -1;
    } while (begin < lVar2);
    if (0 < iVar4) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"parentheses mismatch");
LAB_00167898:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return end;
}

Assistant:

int findLocation(const std::string& str, int begin, int end, char op)
{
  int level = 0;
  for (int i=end-1; i>=begin; --i) {
    char c = str[i];
    if (c == ')') {
      ++level;
      continue;
    }
    if (c == '(') {
      --level;
      if (level < 0)
        throw std::runtime_error("parentheses mismatch");
      continue;
    }
    if (level > 0) continue;
    if (c == op)
      return i;
  }
  if (level > 0) throw std::runtime_error("parentheses mismatch");
  return end;
}